

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dictionary.cc
# Opt level: O3

vector<int,_std::allocator<int>_> * __thiscall
fasttext::Dictionary::getSubwords
          (vector<int,_std::allocator<int>_> *__return_storage_ptr__,Dictionary *this,string *word)

{
  pointer __s1;
  size_t __n;
  int32_t i;
  int iVar1;
  vector<int,_std::allocator<int>_> *__x;
  long *plVar2;
  size_type *psVar3;
  string_view w;
  string local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  __s1 = (word->_M_dataplus)._M_p;
  __n = word->_M_string_length;
  w._M_str = __s1;
  w._M_len = __n;
  i = getId(this,w);
  if (-1 < i) {
    __x = getSubwords(this,i);
    std::vector<int,_std::allocator<int>_>::vector(__return_storage_ptr__,__x);
    return __return_storage_ptr__;
  }
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  if (__n == DAT_0014c470) {
    if (__n == 0) {
      return __return_storage_ptr__;
    }
    iVar1 = bcmp(__s1,EOS_abi_cxx11_,__n);
    if (iVar1 == 0) {
      return __return_storage_ptr__;
    }
  }
  std::operator+(&local_48,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &BOW_abi_cxx11_,word);
  plVar2 = (long *)std::__cxx11::string::_M_append((char *)&local_48,EOW_abi_cxx11_);
  psVar3 = (size_type *)(plVar2 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar2 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar3) {
    local_68.field_2._M_allocated_capacity = *psVar3;
    local_68.field_2._8_8_ = plVar2[3];
    local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  }
  else {
    local_68.field_2._M_allocated_capacity = *psVar3;
    local_68._M_dataplus._M_p = (pointer)*plVar2;
  }
  local_68._M_string_length = plVar2[1];
  *plVar2 = (long)psVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  computeSubwords(this,&local_68,__return_storage_ptr__,
                  (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)0x0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

const std::vector<int32_t> Dictionary::getSubwords(
    const std::string& word) const {
  int32_t i = getId(word);
  if (i >= 0) {
    return getSubwords(i);
  }
  std::vector<int32_t> ngrams;
  if (word != EOS) {
    computeSubwords(BOW + word + EOW, ngrams);
  }
  return ngrams;
}